

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_>::ImmediatePromiseNode
          (ImmediatePromiseNode<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *this,
          ExceptionOr<kj::Maybe<kj::Own<capnp::IncomingRpcMessage>_>_> *result)

{
  bool bVar1;
  IncomingRpcMessage *pIVar2;
  
  ImmediatePromiseNodeBase::ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_0060f9d0;
  Maybe<kj::Exception>::Maybe((Maybe<kj::Exception> *)&this->result,(Maybe<kj::Exception> *)result);
  bVar1 = (result->value).ptr.isSet;
  (this->result).value.ptr.isSet = bVar1;
  if (bVar1 == true) {
    pIVar2 = (result->value).ptr.field_1.value.ptr.ptr;
    (this->result).value.ptr.field_1.value.ptr.disposer =
         (result->value).ptr.field_1.value.ptr.disposer;
    (this->result).value.ptr.field_1.value.ptr.ptr = pIVar2;
    (result->value).ptr.field_1.value.ptr.ptr = (IncomingRpcMessage *)0x0;
  }
  return;
}

Assistant:

ImmediatePromiseNode(ExceptionOr<T>&& result): result(kj::mv(result)) {}